

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.h
# Opt level: O2

void __thiscall BuildStatus::SlidingRateInfo::UpdateRate(SlidingRateInfo *this,int update_hint)

{
  queue<double,_std::deque<double,_std::allocator<double>_>_> *this_00;
  double *pdVar1;
  size_type sVar2;
  _Elt_pointer pdVar3;
  undefined1 auVar4 [16];
  double local_18;
  
  if (this->last_update_ != update_hint) {
    this->last_update_ = update_hint;
    this_00 = &this->times_;
    sVar2 = std::deque<double,_std::allocator<double>_>::size(&this_00->c);
    if (sVar2 == this->N) {
      std::deque<double,_std::allocator<double>_>::pop_front(&this_00->c);
    }
    local_18 = Stopwatch::Elapsed(&this->stopwatch_);
    std::deque<double,_std::allocator<double>_>::emplace_back<double>(&this_00->c,&local_18);
    pdVar3 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pdVar3 == (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pdVar3 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pdVar1 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((pdVar3[-1] != *pdVar1) || (NAN(pdVar3[-1]) || NAN(*pdVar1))) {
      sVar2 = std::deque<double,_std::allocator<double>_>::size(&this_00->c);
      auVar4._8_4_ = (int)(sVar2 >> 0x20);
      auVar4._0_8_ = sVar2;
      auVar4._12_4_ = 0x45300000;
      pdVar3 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pdVar3 == (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pdVar3 = (this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      this->rate_ = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                    (pdVar3[-1] -
                    *(this->times_).c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur);
    }
  }
  return;
}

Assistant:

void UpdateRate(int update_hint) {
      if (update_hint == last_update_)
        return;
      last_update_ = update_hint;

      if (times_.size() == N)
        times_.pop();
      times_.push(stopwatch_.Elapsed());
      if (times_.back() != times_.front())
        rate_ = times_.size() / (times_.back() - times_.front());
    }